

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SPPMIntegrator::SampleLd
          (SPPMIntegrator *this,SurfaceInteraction *intr,BSDF *b,SampledWavelengths *lambda,
          Sampler *sampler,LightSampler *lightSampler)

{
  Normal3<float> n;
  LightSampleContext ctx_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  SampledWavelengths lambda_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3f w;
  Vector3f w_00;
  Vector3f wiRender;
  undefined1 auVar7 [16];
  Vector3f wiRender_00;
  undefined1 auVar8 [16];
  Vector3f woRender;
  undefined1 auVar9 [16];
  Vector3f woRender_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  array<float,_4> aVar16;
  bool bVar17;
  LightType type;
  LightLiSample *pLVar18;
  Tuple2<pbrt::Point2,_float> *in_RCX;
  SurfaceInteraction *in_RSI;
  Point2f PVar19;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [56];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  SampledSpectrum SVar26;
  Vector3<float> VVar27;
  Point3f PVar28;
  Float w_l;
  Float p_b;
  Float p_l;
  SampledSpectrum f;
  Vector3f wi;
  Vector3f wo;
  optional<pbrt::LightLiSample> ls;
  Light light;
  Point2f uLight;
  optional<pbrt::SampledLight> sampledLight;
  Float u;
  BxDFFlags flags;
  LightSampleContext ctx;
  BSDF *bsdf;
  Sampler *in_stack_fffffffffffffa58;
  Interval s;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffa60;
  Interval s_00;
  undefined8 in_stack_fffffffffffffa68;
  Float u_00;
  Interval this_00;
  int nf;
  LightSampleContext *in_stack_fffffffffffffa70;
  Point3f *in_stack_fffffffffffffa78;
  Point3fi *in_stack_fffffffffffffa80;
  Tuple2<pbrt::Point2,_float> u_01;
  Tuple2<pbrt::Point2,_float> this_01;
  float fVar29;
  Tuple2<pbrt::Point2,_float> TVar30;
  undefined8 in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  float in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined8 in_stack_fffffffffffffac8;
  undefined8 in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  Interaction *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffb08;
  TransportMode in_stack_fffffffffffffb0c;
  float in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined8 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined8 in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb30;
  undefined4 uStack_4cc;
  undefined8 in_stack_fffffffffffffb38;
  float in_stack_fffffffffffffb40;
  undefined4 uStack_4bc;
  undefined8 in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb50;
  undefined4 uStack_4ac;
  undefined8 in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb60;
  undefined4 uStack_49c;
  optional local_1e8 [128];
  undefined4 local_168;
  undefined8 local_158;
  optional local_150 [28];
  Float local_134;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f4;
  float local_ec;
  Interval local_e8;
  Interval local_e0;
  Interval local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  Interval local_94;
  Interval local_8c;
  Interval local_84;
  BxDFFlags local_7c;
  undefined1 local_78 [39];
  bool bStack_51;
  Interaction *pIStack_50;
  Tuple2<pbrt::Point2,_float> *local_30;
  SurfaceInteraction *local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar21 [64];
  
  u_00 = (Float)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  auVar25 = in_ZMM0._8_56_;
  local_30 = in_RCX;
  local_20 = in_RSI;
  LightSampleContext::LightSampleContext((LightSampleContext *)local_78,in_RSI);
  local_7c = BSDF::Flags((BSDF *)0x931b19);
  bVar17 = IsReflective(Unset);
  if ((!bVar17) || (bVar17 = IsTransmissive(Unset), bVar17)) {
    bVar17 = IsTransmissive(Unset);
    if ((bVar17) && (bVar17 = IsReflective(Unset), !bVar17)) {
      VVar27 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffa60);
      local_118 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar25;
      local_120 = vmovlpd_avx(auVar21._0_16_);
      auVar25 = ZEXT856(0);
      w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb0c;
      w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffb08;
      w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb10;
      local_110 = local_120;
      local_108 = local_118;
      local_100 = local_120;
      local_f8 = local_118;
      PVar28 = Interaction::OffsetRayOrigin(in_stack_fffffffffffffaf0,w_00);
      local_128 = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
      auVar22._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar22._8_56_ = auVar25;
      local_130 = vmovlpd_avx(auVar22._0_16_);
      local_f4 = local_130;
      local_ec = local_128;
      Point3fi::Point3fi(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_78._0_4_ = local_e8.low;
      local_78._4_4_ = local_e8.high;
      local_78._8_4_ = local_e0.low;
      local_78._12_4_ = local_e0.high;
      local_78._16_4_ = local_d8.low;
      local_78._20_4_ = local_d8.high;
    }
  }
  else {
    local_b8 = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_c0._0_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_c0._4_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar25 = ZEXT856(0);
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb0c;
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffb08;
    w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb10;
    local_b0 = local_c0;
    local_a8 = local_b8;
    PVar28 = Interaction::OffsetRayOrigin(in_stack_fffffffffffffaf0,w);
    local_c8 = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar20._8_56_ = auVar25;
    local_d0 = vmovlpd_avx(auVar20._0_16_);
    local_a0 = local_d0;
    local_98 = local_c8;
    Point3fi::Point3fi(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    local_78._0_4_ = local_94.low;
    local_78._4_4_ = local_94.high;
    local_78._8_4_ = local_8c.low;
    local_78._12_4_ = local_8c.high;
    local_78._16_4_ = local_84.low;
    local_78._20_4_ = local_84.high;
  }
  local_134 = Sampler::Get1D((Sampler *)in_stack_fffffffffffffa60);
  LightSampler::Sample((LightSampler *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,u_00);
  PVar19 = Sampler::Get2D(in_stack_fffffffffffffa58);
  auVar15._8_8_ = extraout_XMM0_Qb;
  auVar15._0_4_ = PVar19.super_Tuple2<pbrt::Point2,_float>.x;
  auVar15._4_4_ = PVar19.super_Tuple2<pbrt::Point2,_float>.y;
  local_158 = vmovlpd_avx(auVar15);
  bVar17 = pstd::optional::operator_cast_to_bool(local_150);
  if (!bVar17) {
    memset(&local_10,0,0x10);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x931de6);
    local_168 = 1;
    goto LAB_00932630;
  }
  pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x931e1c);
  Light::Light((Light *)in_stack_fffffffffffffa60,(Light *)in_stack_fffffffffffffa58);
  u_01 = *local_30;
  this_01 = local_30[1];
  TVar30 = local_30[3];
  fVar29 = local_30[2].y;
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
       (Float)(int)in_stack_fffffffffffffaa8;
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
       (Float)(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = TVar30.x
  ;
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
       TVar30.y;
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
       (Float)(int)in_stack_fffffffffffffab0;
  ctx_00.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
       (Float)(int)((ulong)in_stack_fffffffffffffab0 >> 0x20);
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffab8;
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffac0;
  ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffac4;
  ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffffac8;
  ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  lambda_00.lambda.values[2] = (float)(int)in_stack_fffffffffffffad8;
  lambda_00.lambda.values[3] = (float)(int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffffad0;
  lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffad0 >> 0x20);
  lambda_00.pdf.values[0] = (float)(int)in_stack_fffffffffffffae0;
  lambda_00.pdf.values[1] = (float)(int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  lambda_00.pdf.values[2] = (float)(int)in_stack_fffffffffffffae8;
  lambda_00.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  s = (Interval)local_78._0_8_;
  s_00 = (Interval)local_78._8_8_;
  this_00 = (Interval)local_78._16_8_;
  Light::SampleLi((Light *)pIStack_50,ctx_00,(Point2f)u_01,lambda_00,bStack_51);
  bVar17 = pstd::optional::operator_cast_to_bool(local_1e8);
  if (bVar17) {
    pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x931f10);
    bVar17 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)this_00);
    if (!bVar17) goto LAB_00931f6d;
    pLVar18 = pstd::optional<pbrt::LightLiSample>::operator->
                        ((optional<pbrt::LightLiSample> *)0x931f4a);
    if ((pLVar18->pdf == 0.0) && (!NAN(pLVar18->pdf))) goto LAB_00931f6d;
    pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x931fef);
    uVar23 = 0;
    uVar24 = 0;
    woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb50;
    woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb48;
    woRender.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb30;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb28;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
    SVar26 = BSDF::f((BSDF *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),woRender,
                     wiRender,in_stack_fffffffffffffb0c);
    auVar13._8_8_ = uVar24;
    auVar13._0_8_ = SVar26.values.values._8_8_;
    auVar14._8_8_ = uVar23;
    auVar14._0_8_ = SVar26.values.values._0_8_;
    vmovlpd_avx(auVar14);
    vmovlpd_avx(auVar13);
    uVar24 = 0;
    VVar27.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffac0;
    VVar27.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffab8;
    VVar27.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
    n.super_Tuple3<pbrt::Normal3,_float>.y = TVar30.x;
    n.super_Tuple3<pbrt::Normal3,_float>.z = TVar30.y;
    n.super_Tuple3<pbrt::Normal3,_float>.x = fVar29;
    AbsDot<float>(VVar27,n);
    uVar23 = 0;
    SVar26 = SampledSpectrum::operator*((SampledSpectrum *)local_78._24_8_,this_00.high);
    nf = (int)local_78._24_8_;
    auVar11._8_8_ = uVar24;
    auVar11._0_8_ = SVar26.values.values._8_8_;
    auVar12._8_8_ = uVar23;
    auVar12._0_8_ = SVar26.values.values._0_8_;
    vmovlpd_avx(auVar12);
    vmovlpd_avx(auVar11);
    bVar17 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)this_00);
    if (bVar17) {
      pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x93223a);
      bVar17 = Integrator::Unoccluded((Integrator *)this_01,(Interaction *)u_01,pIStack_50);
      if (!bVar17) goto LAB_0093227b;
      pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x9322b9);
      pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x9322e6);
      uVar24 = 0;
      uVar23 = 0;
      type = Light::Type((Light *)s_00);
      bVar17 = IsDeltaLight(type);
      if (bVar17) {
        pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x93235b);
        SVar26 = SampledSpectrum::operator*((SampledSpectrum *)this_00,(SampledSpectrum *)s_00);
        uStack_4ac = (undefined4)((ulong)uVar24 >> 0x20);
        uStack_49c = (undefined4)((ulong)uVar23 >> 0x20);
        auVar9._8_4_ = (int)uVar24;
        auVar9._0_8_ = SVar26.values.values._8_8_;
        auVar9._12_4_ = uStack_4ac;
        auVar10._8_4_ = (int)uVar23;
        auVar10._0_8_ = SVar26.values.values._0_8_;
        auVar10._12_4_ = uStack_49c;
        uVar23 = auVar10._8_8_;
        vmovlpd_avx(auVar10);
        vmovlpd_avx(auVar9);
        uVar24 = 0;
        SVar26 = SampledSpectrum::operator/((SampledSpectrum *)this_00,s_00.high);
        uStack_4cc = (undefined4)((ulong)uVar23 >> 0x20);
        uStack_4bc = (undefined4)((ulong)uVar24 >> 0x20);
        auVar7._8_4_ = (int)uVar23;
        auVar7._0_8_ = SVar26.values.values._8_8_;
        auVar7._12_4_ = uStack_4cc;
        auVar8._8_4_ = (int)uVar24;
        auVar8._0_8_ = SVar26.values.values._0_8_;
        auVar8._12_4_ = uStack_4bc;
        local_10 = vmovlpd_avx(auVar8);
        local_8 = vmovlpd_avx(auVar7);
      }
      else {
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb60;
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb58;
        woRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
        wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb40;
        wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffb38;
        wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
        BSDF::PDF((BSDF *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),woRender_00,
                  wiRender_00,(TransportMode)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                  (BxDFReflTransFlags)in_stack_fffffffffffffb18);
        uVar24 = 0;
        PowerHeuristic(nf,this_00.high,(int)this_00.low,s_00.high);
        pstd::optional<pbrt::LightLiSample>::operator->((optional<pbrt::LightLiSample> *)0x932537);
        uVar23 = 0;
        SVar26 = pbrt::operator*(s_00.high,(SampledSpectrum *)s);
        auVar5._8_8_ = uVar24;
        auVar5._0_8_ = SVar26.values.values._8_8_;
        auVar6._8_8_ = uVar23;
        auVar6._0_8_ = SVar26.values.values._0_8_;
        vmovlpd_avx(auVar6);
        vmovlpd_avx(auVar5);
        SVar26 = SampledSpectrum::operator*((SampledSpectrum *)this_00,(SampledSpectrum *)s_00);
        auVar3._8_8_ = uVar23;
        auVar3._0_8_ = SVar26.values.values._8_8_;
        auVar4._8_8_ = uVar24;
        auVar4._0_8_ = SVar26.values.values._0_8_;
        vmovlpd_avx(auVar4);
        vmovlpd_avx(auVar3);
        uVar23 = 0;
        SVar26 = SampledSpectrum::operator/((SampledSpectrum *)this_00,s_00.high);
        auVar1._8_8_ = uVar24;
        auVar1._0_8_ = SVar26.values.values._8_8_;
        auVar2._8_4_ = (int)uVar23;
        auVar2._0_8_ = SVar26.values.values._0_8_;
        auVar2._12_4_ = (int)((ulong)uVar23 >> 0x20);
        local_10 = vmovlpd_avx(auVar2);
        local_8 = vmovlpd_avx(auVar1);
      }
    }
    else {
LAB_0093227b:
      memset(&local_10,0,0x10);
      SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x93229c);
    }
  }
  else {
LAB_00931f6d:
    memset(&local_10,0,0x10);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x931f8e);
  }
  local_168 = 1;
  pstd::optional<pbrt::LightLiSample>::~optional((optional<pbrt::LightLiSample> *)0x932630);
LAB_00932630:
  pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x93263d);
  aVar16.values[2] = (float)(undefined4)local_8;
  aVar16.values[3] = (float)local_8._4_4_;
  aVar16.values[0] = (float)(undefined4)local_10;
  aVar16.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar16.values;
}

Assistant:

SampledSpectrum SPPMIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &b,
                                         SampledWavelengths &lambda, Sampler sampler,
                                         LightSampler lightSampler) const {
    const BSDF *bsdf = &b;
    // Initialize _LightSampleContext_ for light sampling
    LightSampleContext ctx(intr);
    // Try to nudge the light sampling position to correct side of the surface
    BxDFFlags flags = bsdf->Flags();
    if (IsReflective(flags) && !IsTransmissive(flags))
        ctx.pi = intr.OffsetRayOrigin(intr.wo);
    else if (IsTransmissive(flags) && !IsReflective(flags))
        ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    // Choose a light source for the direct lighting calculation
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};

    // Sample a point on the light source for direct lighting
    Light light = sampledLight->light;
    DCHECK(light && sampledLight->p > 0);
    pstd::optional<LightLiSample> ls = light.SampleLi(ctx, uLight, lambda, true);
    if (!ls || !ls->L || ls->pdf == 0)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls->wi;
    SampledSpectrum f = bsdf->f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls->pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float p_l = sampledLight->p * ls->pdf;
    if (IsDeltaLight(light.Type()))
        return ls->L * f / p_l;
    else {
        Float p_b = bsdf->PDF(wo, wi);
        Float w_l = PowerHeuristic(1, p_l, 1, p_b);
        return w_l * ls->L * f / p_l;
    }
}